

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ResetQueryPool
          (VulkanCommandBuffer *this,VkQueryPool queryPool,uint32_t firstQuery,uint32_t queryCount)

{
  Char *Message;
  undefined4 in_register_0000000c;
  undefined1 local_40 [8];
  string msg;
  uint32_t queryCount_local;
  uint32_t firstQuery_local;
  VkQueryPool queryPool_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_4_ = queryCount;
  msg.field_2._12_4_ = firstQuery;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,queryCount));
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"ResetQueryPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x286);
    std::__cxx11::string::~string((string *)local_40);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdResetQueryPool)(this->m_VkCmdBuffer,queryPool,msg.field_2._12_4_,msg.field_2._8_4_);
  return;
}

Assistant:

__forceinline void ResetQueryPool(VkQueryPool queryPool,
                                      uint32_t    firstQuery,
                                      uint32_t    queryCount)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Query pool reset must be performed outside of render pass (17.2).
        EndRenderScope();
        FlushBarriers();
        vkCmdResetQueryPool(m_VkCmdBuffer, queryPool, firstQuery, queryCount);
    }